

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_rotatev3(matrix4 *self,vector3 *axis,double angle)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  matrix4 rotationMatrix;
  undefined1 local_e8 [24];
  double dStack_d0;
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  matrix4 local_90;
  
  local_b8 = (axis->field_0).v[2];
  uStack_b0 = 0;
  local_a8 = (axis->field_0).v[0];
  dStack_a0 = (axis->field_0).v[1];
  dVar1 = sin(angle * 0.5);
  local_c8._8_4_ = extraout_XMM0_Dc;
  local_c8._0_8_ = dVar1;
  local_c8._12_4_ = extraout_XMM0_Dd;
  dStack_d0 = cos(angle * 0.5);
  auVar5._0_8_ = local_b8 * (double)local_c8._0_8_;
  local_e8._0_8_ = (double)local_c8._0_8_ * local_a8;
  local_e8._8_8_ = (double)local_c8._0_8_ * dStack_a0;
  local_e8._16_8_ = auVar5._0_8_;
  dVar1 = SQRT(dStack_d0 * dStack_d0 +
               auVar5._0_8_ * auVar5._0_8_ +
               local_e8._0_8_ * local_e8._0_8_ + local_e8._8_8_ * local_e8._8_8_);
  if (1e-05 <= dVar1) {
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
    auVar2._8_4_ = SUB84(dVar1,0);
    auVar2._0_8_ = dVar1;
    auVar2._12_4_ = uVar4;
    local_e8._0_16_ = divpd(local_e8._0_16_,auVar2);
    auVar5._8_8_ = dStack_d0;
    auVar3._8_4_ = SUB84(dVar1,0);
    auVar3._0_8_ = dVar1;
    auVar3._12_4_ = uVar4;
    register0x000012c0 = divpd(auVar5,auVar3);
  }
  matrix4_make_transformation_rotationq(&local_90,(quaternion *)local_e8);
  matrix4_multiply(self,&local_90);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_rotatev3(struct matrix4 *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct matrix4 rotationMatrix;
	struct quaternion q;

	return matrix4_multiply(self,
				matrix4_make_transformation_rotationq(&rotationMatrix,
								      quaternion_set_from_axis_anglev3(&q, axis, angle)));
}